

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importedentity.cpp
# Opt level: O1

void __thiscall libcellml::ImportedEntity::~ImportedEntity(ImportedEntity *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ImportedEntityImpl *pIVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this->_vptr_ImportedEntity = (_func_int **)&PTR___cxa_pure_virtual_002f5da0;
  pIVar2 = this->mPimpl;
  if (pIVar2 != (ImportedEntityImpl *)0x0) {
    pcVar3 = (pIVar2->mImportReference)._M_dataplus._M_p;
    paVar1 = &(pIVar2->mImportReference).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    this_00 = (pIVar2->mImportSource).
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    operator_delete(pIVar2,0x30);
    return;
  }
  return;
}

Assistant:

ImportedEntity::~ImportedEntity()
{
    delete mPimpl;
}